

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall
Board::draw_board(Board *this,set<Point,_std::less<Point>,_std::allocator<Point>_> *options,
                 Color color,uint turn)

{
  uchar uVar1;
  char cVar2;
  const_iterator cVar3;
  iterator iVar4;
  short sVar5;
  int iVar6;
  dimension x;
  int iVar7;
  uchar background;
  bool bVar8;
  set<Point,_std::less<Point>,_std::allocator<Point>_> threatened;
  Point local_a0;
  Point local_9c;
  string local_98;
  int local_74;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> *local_70;
  _Base_ptr local_68;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> local_60;
  
  local_70 = &options->_M_t;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  sVar5 = -8;
  do {
    print_char_index((char)sVar5 + 'I');
    sVar5 = sVar5 + 1;
  } while (sVar5 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  get_threatened((set<Point,_std::less<Point>,_std::allocator<Point>_> *)&local_60,this,color,turn);
  local_68 = &(((_Rep_type *)&local_70->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  iVar6 = 7;
  do {
    sVar5 = (short)iVar6;
    local_74 = (int)(short)(sVar5 + 1);
    print_index(sVar5 + 1);
    iVar7 = 0;
    do {
      x = (dimension)iVar7;
      Point::Point((Point *)&local_98,x,sVar5);
      if (*(long *)(*(long *)&(this->m_board).m_data.
                              super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [(short)local_98._M_dataplus._M_p].
                              super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                   + (long)local_98._M_dataplus._M_p._2_2_ * 0x10) == 0) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"  ","");
        print_colorful(&local_98,'\0',((char)iVar6 + (char)iVar7 & 1U) * '\x02' + 0xf3);
      }
      else {
        Point::Point((Point *)&local_98,x,sVar5);
        cVar3 = std::
                _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                ::find(local_70,(key_type *)&local_98);
        if (cVar3._M_node == local_68) {
          background = ((char)iVar6 + (char)iVar7 & 1U) * '\x02' + 0xf3;
        }
        else {
          Point::Point((Point *)&local_98,x,sVar5);
          iVar4 = std::
                  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                  ::find(&local_60,(key_type *)&local_98);
          if ((_Rb_tree_header *)iVar4._M_node == &local_60._M_impl.super__Rb_tree_header) {
            background = '\"';
            uVar1 = '\x1c';
          }
          else {
            background = 0xa0;
            uVar1 = '|';
          }
          if ((iVar6 + iVar7 & 1U) == 0) {
            background = uVar1;
          }
        }
        Point::Point(&local_9c,x,sVar5);
        (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_9c.m_x].
                                           super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                + (long)local_9c.m_y * 0x10) + 0x18))(&local_98);
        Point::Point(&local_a0,x,sVar5);
        cVar2 = (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                                                                                      
                                                  super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_a0.m_x].
                                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                        + (long)local_a0.m_y * 0x10) + 0x20))();
        print_colorful(&local_98,-cVar2,background);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 8);
    print_index((dimension)local_74);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    bVar8 = iVar6 != 0;
    iVar6 = iVar6 + -1;
  } while (bVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  sVar5 = -8;
  do {
    print_char_index((char)sVar5 + 'I');
    sVar5 = sVar5 + 1;
  } while (sVar5 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
  ~_Rb_tree(&local_60);
  return;
}

Assistant:

void Board::draw_board(const set<Point> &options, Color color, unsigned int turn) const {
    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
    unsigned char background;

#if DISPLAY_THREATENED
    auto threatened = get_threatened(color, turn);
#endif // DISPLAY_THREATENED

    for (dimension i = SIZE - 1; i >= 0; i--) {
        print_index(i + 1);
        for (dimension j = 0; j < SIZE; j++) {
            if (m_board[{j, i}] == nullptr) {
                print_colorful("  ", 0, ((i + j) % 2 ? colors::light_gray : colors::dark_gray));
                continue;
            }
#if DISPLAY_HINTS
            if ((options.find({j, i}) != options.end())) {
#if DISPLAY_THREATENED
                if (threatened.find({j, i}) != threatened.end()) {
                    background = (i + j) % 2 ? colors::light_red : colors::dark_red;
                } else {
#endif // DISPLAY_THREATENED
#endif // DISPLAY_HINTS
                    background = (i + j) % 2 ? colors::light_green : colors::dark_green;
#if DISPLAY_THREATENED
                }
#endif // DISPLAY_THREATENED
#if DISPLAY_HINTS
            } else {
                background = (i + j) % 2 ? colors::light_gray : colors::dark_gray;
            }
#endif // DISPLAY_HINTS
            print_colorful(m_board[{j, i}]->get_representation(),
                           (m_board[{j, i}]->get_color()) ? colors::white : colors::black, background);
        }
        print_index(i + 1);
        cout << endl;
    }

    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
}

void Board::draw_board(const set<Point> &possible_moves, const map<Point, play> &possible_plays, const Point &chosen,
                       unsigned int turn) {
    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
    unsigned char background;

#if DISPLAY_THREATENED
    auto threatened = get_threatened(possible_moves, possible_plays, chosen, turn);
#endif // DISPLAY_THREATENED

    for (dimension i = SIZE - 1; i >= 0; i--) {
        print_index(i + 1);
        for (dimension j = 0; j < SIZE; j++) {
            if (Point(j, i) == chosen) {
                background = 220;
#if DISPLAY_HINTS
            } else if ((possible_moves.find({j, i}) == possible_moves.end())) {
#else
                }
#endif // DISPLAY_HINTS
                background = (i + j) % 2 ? colors::light_gray : colors::dark_gray;
#if DISPLAY_HINTS
            } else {
#if DISPLAY_THREATENED
                if (threatened.find({j, i}) != threatened.end()) {
                    background = (i + j) % 2 ? colors::light_red : colors::dark_red;
                } else {
#endif // DISPLAY_THREATENED
                    background = (i + j) % 2 ? colors::light_green : colors::dark_green;
#if DISPLAY_THREATENED
                }
#endif // DISPLAY_THREATENED
            }
#endif // DISPLAY_HINTS

            if (m_board[{j, i}] == nullptr) {
                print_colorful("  ", colors::black, background);
            } else {
                print_colorful(m_board[{j, i}]->get_representation(),
                               (m_board[{j, i}]->get_color()) ? colors::white : colors::black, background);
            }
        }
        print_index(i + 1);
        cout << endl;
    }

    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
}